

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.c
# Opt level: O0

uint64_t nn_clock_ms(void)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  uint *puVar3;
  undefined1 local_20 [8];
  timespec tv;
  int rc;
  
  tv.tv_nsec._4_4_ = clock_gettime(1,(timespec *)local_20);
  if (tv.tv_nsec._4_4_ != 0) {
    nn_backtrace_print();
    __stream = _stderr;
    piVar1 = __errno_location();
    pcVar2 = nn_err_strerror(*piVar1);
    puVar3 = (uint *)__errno_location();
    fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)*puVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tools/../src/utils/clock.c"
            ,0x4c);
    fflush(_stderr);
    nn_err_abort();
  }
  return (long)local_20 * 1000 + tv.tv_sec / 1000000;
}

Assistant:

uint64_t nn_clock_ms (void)
{
#if defined NN_HAVE_WINDOWS

    LARGE_INTEGER tps;
    LARGE_INTEGER time;
    double tpms;

    QueryPerformanceFrequency (&tps);
    QueryPerformanceCounter (&time);
    tpms = (double) (tps.QuadPart / 1000);
    return (uint64_t) (time.QuadPart / tpms);

#elif defined NN_HAVE_OSX

    static mach_timebase_info_data_t nn_clock_timebase_info;
    uint64_t ticks;

    /*  If the global timebase info is not initialised yet, init it. */
    if (nn_slow (!nn_clock_timebase_info.denom))
        mach_timebase_info (&nn_clock_timebase_info);

    ticks = mach_absolute_time ();
    return ticks * nn_clock_timebase_info.numer /
        nn_clock_timebase_info.denom / 1000000;

#elif defined NN_HAVE_GETHRTIME

    return gethrtime () / 1000000;

#elif defined NN_HAVE_CLOCK_MONOTONIC

    int rc;
    struct timespec tv;

    rc = clock_gettime (CLOCK_MONOTONIC, &tv);
    errno_assert (rc == 0);
    return tv.tv_sec * (uint64_t) 1000 + tv.tv_nsec / 1000000;

#else

    int rc;
    struct timeval tv;

    /*  Gettimeofday is slow on some systems. Moreover, it's not necessarily
        monotonic. Thus, it's used as a last resort mechanism. */
    rc = gettimeofday (&tv, NULL);
    errno_assert (rc == 0);
    return tv.tv_sec * (uint64_t) 1000 + tv.tv_usec / 1000;

#endif
}